

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

string * __thiscall
cmState::ModeToString_abi_cxx11_(string *__return_storage_ptr__,cmState *this,Mode mode)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "UNKNOWN";
    __a = &local_e;
    break;
  case 1:
    __s = "PROJECT";
    __a = &local_9;
    break;
  case 2:
    __s = "SCRIPT";
    __a = &local_a;
    break;
  case 3:
    __s = "FIND_PACKAGE";
    __a = &local_b;
    break;
  case 4:
    __s = "CTEST";
    __a = &local_c;
    break;
  case 5:
    __s = "CPACK";
    __a = &local_d;
    break;
  default:
    __s = "UNKNOWN";
    __a = &local_f;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::ModeToString(cmState::Mode mode)
{
  switch (mode) {
    case Project:
      return "PROJECT";
    case Script:
      return "SCRIPT";
    case FindPackage:
      return "FIND_PACKAGE";
    case CTest:
      return "CTEST";
    case CPack:
      return "CPACK";
    case Unknown:
      return "UNKNOWN";
  }
  return "UNKNOWN";
}